

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

void ucnv_setSubstString_63(UConverter *cnv,UChar *s,int32_t length,UErrorCode *err)

{
  uint uVar1;
  UConverterType UVar2;
  UConverter *cnv_00;
  uint8_t *__dest;
  int32_t cloneSize;
  char chars [32];
  UAlignedMemory cloneBuffer [129];
  UChar *local_478;
  int32_t local_45c;
  UChar local_458 [16];
  undefined1 local_438 [1032];
  
  local_45c = 0x408;
  cnv_00 = ucnv_safeClone_63(cnv,local_438,&local_45c,err);
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    cnv_00->fromUCharErrorBehaviour = UCNV_FROM_U_CALLBACK_STOP_63;
    cnv_00->fromUContext = (void *)0x0;
  }
  local_478 = local_458;
  uVar1 = ucnv_fromUChars_63(cnv_00,(char *)local_478,0x20,s,length,err);
  ucnv_close_63(cnv_00);
  if (U_ZERO_ERROR < *err) {
    return;
  }
  if ((cnv->sharedData->impl->writeSub != (UConverterWriteSub)0x0) &&
     ((cnv->sharedData->staticData->conversionType != '\x02' ||
      (UVar2 = ucnv_MBCSGetType_63(cnv), UVar2 == UCNV_EBCDIC_STATEFUL)))) {
    if (0x20 < length) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      return;
    }
    if (length < 0) {
      length = u_strlen_63(s);
    }
    uVar1 = length * 2;
    local_478 = s;
  }
  if ((int)uVar1 < 5) {
    if (uVar1 == 0) {
      uVar1 = 0;
      goto LAB_0015e908;
    }
    __dest = cnv->subChars;
  }
  else {
    __dest = cnv->subChars;
    if ((UChar *)__dest == cnv->subUChars) {
      __dest = (uint8_t *)uprv_malloc_63(0x40);
      cnv->subChars = __dest;
      if (__dest == (uint8_t *)0x0) {
        cnv->subChars = (uint8_t *)cnv->subUChars;
        *err = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      __dest[0x30] = '\0';
      __dest[0x31] = '\0';
      __dest[0x32] = '\0';
      __dest[0x33] = '\0';
      __dest[0x34] = '\0';
      __dest[0x35] = '\0';
      __dest[0x36] = '\0';
      __dest[0x37] = '\0';
      __dest[0x38] = '\0';
      __dest[0x39] = '\0';
      __dest[0x3a] = '\0';
      __dest[0x3b] = '\0';
      __dest[0x3c] = '\0';
      __dest[0x3d] = '\0';
      __dest[0x3e] = '\0';
      __dest[0x3f] = '\0';
      __dest[0x20] = '\0';
      __dest[0x21] = '\0';
      __dest[0x22] = '\0';
      __dest[0x23] = '\0';
      __dest[0x24] = '\0';
      __dest[0x25] = '\0';
      __dest[0x26] = '\0';
      __dest[0x27] = '\0';
      __dest[0x28] = '\0';
      __dest[0x29] = '\0';
      __dest[0x2a] = '\0';
      __dest[0x2b] = '\0';
      __dest[0x2c] = '\0';
      __dest[0x2d] = '\0';
      __dest[0x2e] = '\0';
      __dest[0x2f] = '\0';
      __dest[0x10] = '\0';
      __dest[0x11] = '\0';
      __dest[0x12] = '\0';
      __dest[0x13] = '\0';
      __dest[0x14] = '\0';
      __dest[0x15] = '\0';
      __dest[0x16] = '\0';
      __dest[0x17] = '\0';
      __dest[0x18] = '\0';
      __dest[0x19] = '\0';
      __dest[0x1a] = '\0';
      __dest[0x1b] = '\0';
      __dest[0x1c] = '\0';
      __dest[0x1d] = '\0';
      __dest[0x1e] = '\0';
      __dest[0x1f] = '\0';
      __dest[0] = '\0';
      __dest[1] = '\0';
      __dest[2] = '\0';
      __dest[3] = '\0';
      __dest[4] = '\0';
      __dest[5] = '\0';
      __dest[6] = '\0';
      __dest[7] = '\0';
      __dest[8] = '\0';
      __dest[9] = '\0';
      __dest[10] = '\0';
      __dest[0xb] = '\0';
      __dest[0xc] = '\0';
      __dest[0xd] = '\0';
      __dest[0xe] = '\0';
      __dest[0xf] = '\0';
    }
  }
  memcpy(__dest,local_478,(long)(int)uVar1);
  if (local_478 != local_458) {
    uVar1 = (uint)(byte)-(char)length;
  }
LAB_0015e908:
  cnv->subCharLen = (int8_t)uVar1;
  cnv->subChar1 = '\0';
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_setSubstString(UConverter *cnv,
                    const UChar *s,
                    int32_t length,
                    UErrorCode *err) {
    UAlignedMemory cloneBuffer[U_CNV_SAFECLONE_BUFFERSIZE / sizeof(UAlignedMemory) + 1];
    char chars[UCNV_ERROR_BUFFER_LENGTH];

    UConverter *clone;
    uint8_t *subChars;
    int32_t cloneSize, length8;

    /* Let the following functions check all arguments. */
    cloneSize = sizeof(cloneBuffer);
    clone = ucnv_safeClone(cnv, cloneBuffer, &cloneSize, err);
    ucnv_setFromUCallBack(clone, UCNV_FROM_U_CALLBACK_STOP, NULL, NULL, NULL, err);
    length8 = ucnv_fromUChars(clone, chars, (int32_t)sizeof(chars), s, length, err);
    ucnv_close(clone);
    if (U_FAILURE(*err)) {
        return;
    }

    if (cnv->sharedData->impl->writeSub == NULL
#if !UCONFIG_NO_LEGACY_CONVERSION
        || (cnv->sharedData->staticData->conversionType == UCNV_MBCS &&
         ucnv_MBCSGetType(cnv) != UCNV_EBCDIC_STATEFUL)
#endif
    ) {
        /* The converter is not stateful. Store the charset bytes as a fixed string. */
        subChars = (uint8_t *)chars;
    } else {
        /*
         * The converter has a non-default writeSub() function, indicating
         * that it is stateful.
         * Store the Unicode string for on-the-fly conversion for correct
         * state handling.
         */
        if (length > UCNV_ERROR_BUFFER_LENGTH) {
            /*
             * Should not occur. The converter should output at least one byte
             * per UChar, which means that ucnv_fromUChars() should catch all
             * overflows.
             */
            *err = U_BUFFER_OVERFLOW_ERROR;
            return;
        }
        subChars = (uint8_t *)s;
        if (length < 0) {
            length = u_strlen(s);
        }
        length8 = length * U_SIZEOF_UCHAR;
    }

    /*
     * For storing the substitution string, select either the small buffer inside
     * UConverter or allocate a subChars buffer.
     */
    if (length8 > UCNV_MAX_SUBCHAR_LEN) {
        /* Use a separate buffer for the string. Outside UConverter to not make it too large. */
        if (cnv->subChars == (uint8_t *)cnv->subUChars) {
            /* Allocate a new buffer for the string. */
            cnv->subChars = (uint8_t *)uprv_malloc(UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
            if (cnv->subChars == NULL) {
                cnv->subChars = (uint8_t *)cnv->subUChars;
                *err = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            uprv_memset(cnv->subChars, 0, UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
        }
    }

    /* Copy the substitution string into the UConverter or its subChars buffer. */
    if (length8 == 0) {
        cnv->subCharLen = 0;
    } else {
        uprv_memcpy(cnv->subChars, subChars, length8);
        if (subChars == (uint8_t *)chars) {
            cnv->subCharLen = (int8_t)length8;
        } else /* subChars == s */ {
            cnv->subCharLen = (int8_t)-length;
        }
    }

    /* See comment in ucnv_setSubstChars(). */
    cnv->subChar1 = 0;
}